

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

Symbol * elf_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  char *__s2;
  int iVar1;
  Symbol *pSVar2;
  char **ppcVar3;
  long lVar4;
  
  if (gv->dest_object == 0) {
    __s2 = xref->xrefname;
    ppcVar3 = elf_symnames;
    lVar4 = 0;
    do {
      iVar1 = strcmp(*ppcVar3,__s2);
      if (iVar1 == 0) {
        pSVar2 = elf_makelnksym(gv,(int)lVar4);
        return pSVar2;
      }
      lVar4 = lVar4 + 1;
      ppcVar3 = ppcVar3 + 1;
    } while (lVar4 != 7);
  }
  return (Symbol *)0x0;
}

Assistant:

struct Symbol *elf_lnksym(struct GlobalVars *gv,struct Section *sec,
                          struct Reloc *xref)
/* Check for common ELF linker symbols. */
{
  int i;

  if (!gv->dest_object) {
    for (i=0; i<(sizeof(elf_symnames)/sizeof(elf_symnames[0])); i++) {
      if (!strcmp(elf_symnames[i],xref->xrefname))
        return elf_makelnksym(gv,i);  /* new linker symbol created */
    }
  }
  return NULL;
}